

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigJust.c
# Opt level: O0

void Aig_ManJustExperiment(Aig_Man_t *pAig)

{
  int iVar1;
  uint uVar2;
  abctime aVar3;
  Vec_Int_t *vSuppLits_00;
  Aig_ManPack_t *p;
  Vec_Int_t *p_00;
  Aig_Obj_t *pNode;
  abctime aVar4;
  int local_54;
  uint local_50;
  int nTotalLits;
  int Count1f;
  int Count1;
  int Count0f;
  int Count0;
  abctime clk;
  int i;
  Aig_Obj_t *pObj;
  Vec_Int_t *vNodes;
  Vec_Int_t *vSuppLits;
  Aig_ManPack_t *pPack;
  Aig_Man_t *pAig_local;
  
  aVar3 = Abc_Clock();
  Count1 = 0;
  Count1f = 0;
  nTotalLits = 0;
  local_50 = 0;
  local_54 = 0;
  vSuppLits_00 = Vec_IntAlloc(100);
  p = Aig_ManPackStart(pAig);
  p_00 = Aig_ManPackConstNodes(p);
  for (clk._4_4_ = 0; iVar1 = Vec_IntSize(p_00), clk._4_4_ < iVar1; clk._4_4_ = clk._4_4_ + 1) {
    iVar1 = Vec_IntEntry(p_00,clk._4_4_);
    pNode = Aig_ManObj(pAig,iVar1);
    if ((*(ulong *)&pNode->field_0x18 >> 3 & 1) == 0) {
      iVar1 = Aig_ObjFindSatAssign(pAig,pNode,1,vSuppLits_00);
      if (iVar1 == 0) {
        local_50 = local_50 + 1;
      }
      else {
        nTotalLits = nTotalLits + 1;
        iVar1 = Vec_IntSize(vSuppLits_00);
        local_54 = iVar1 + local_54;
        Aig_ManPackAddPattern(p,vSuppLits_00);
      }
    }
    else {
      iVar1 = Aig_ObjFindSatAssign(pAig,pNode,0,vSuppLits_00);
      if (iVar1 == 0) {
        Count1f = Count1f + 1;
      }
      else {
        Count1 = Count1 + 1;
        iVar1 = Vec_IntSize(vSuppLits_00);
        local_54 = iVar1 + local_54;
        Aig_ManPackAddPattern(p,vSuppLits_00);
      }
    }
  }
  Vec_IntFree(vSuppLits_00);
  uVar2 = Aig_ManCoNum(pAig);
  iVar1 = Aig_ManCoNum(pAig);
  printf("PO =%6d. C0 =%6d. C0f =%6d. C1 =%6d. C1f =%6d. (%6.2f %%) Ave =%4.1f ",
         ((double)(Count1 + nTotalLits) * 100.0) / (double)iVar1,
         ((double)local_54 * 1.0) / (double)(Count1 + nTotalLits),(ulong)uVar2,(ulong)(uint)Count1,
         (ulong)(uint)Count1f,(ulong)(uint)nTotalLits,(ulong)local_50);
  aVar4 = Abc_Clock();
  Abc_PrintTime(1,"T",aVar4 - aVar3);
  Aig_ManCleanMarkAB(pAig);
  Aig_ManPackStop(p);
  Vec_IntFree(p_00);
  return;
}

Assistant:

void Aig_ManJustExperiment( Aig_Man_t * pAig )
{
    Aig_ManPack_t * pPack;
    Vec_Int_t * vSuppLits, * vNodes;
    Aig_Obj_t * pObj;
    int i;
    abctime clk = Abc_Clock();
    int Count0 = 0, Count0f = 0, Count1 = 0, Count1f = 0;
    int nTotalLits = 0;
    vSuppLits = Vec_IntAlloc( 100 );
    pPack = Aig_ManPackStart( pAig );
    vNodes = Aig_ManPackConstNodes( pPack );
//    Aig_ManForEachCo( pAig, pObj, i )
    Aig_ManForEachObjVec( vNodes, pAig, pObj, i )
    {
        if ( pObj->fPhase ) // const 1
        {
            if ( Aig_ObjFindSatAssign(pAig, pObj, 0, vSuppLits) )
            {
//                assert( Aig_ObjTerSimulate(pAig, pObj, vSuppLits) == AIG_VAL0 );
//                if ( Aig_ObjTerSimulate(pAig, pObj, vSuppLits) != AIG_VAL0 )
//                    printf( "Justification error!\n" );
                Count0++;
                nTotalLits += Vec_IntSize(vSuppLits);
                Aig_ManPackAddPattern( pPack, vSuppLits );
            }
            else
                Count0f++;
        }
        else
        {
            if ( Aig_ObjFindSatAssign(pAig, pObj, 1, vSuppLits) )
            {
//                assert( Aig_ObjTerSimulate(pAig, pObj, vSuppLits) == AIG_VAL1 );
//                if ( Aig_ObjTerSimulate(pAig, pObj, vSuppLits) != AIG_VAL1 )
//                    printf( "Justification error!\n" );
                Count1++;
                nTotalLits += Vec_IntSize(vSuppLits);
                Aig_ManPackAddPattern( pPack, vSuppLits );
            }
            else
                Count1f++;
        }
    }
    Vec_IntFree( vSuppLits );
    printf( "PO =%6d. C0 =%6d. C0f =%6d. C1 =%6d. C1f =%6d. (%6.2f %%) Ave =%4.1f ", 
        Aig_ManCoNum(pAig), Count0, Count0f, Count1, Count1f, 100.0*(Count0+Count1)/Aig_ManCoNum(pAig), 1.0*nTotalLits/(Count0+Count1) );
    Abc_PrintTime( 1, "T", Abc_Clock() - clk );
    Aig_ManCleanMarkAB( pAig );
    Aig_ManPackStop( pPack );
    Vec_IntFree( vNodes );
}